

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# merl.cpp
# Opt level: O3

void release(void)

{
  djg_buffer *__ptr;
  djg_clock *__ptr_00 [1];
  bool bVar1;
  GLboolean GVar2;
  bool bVar3;
  long lVar4;
  
  __ptr_00[0] = g_gl.clocks[0];
  if (g_gl.clocks[0] != (djg_clock *)0x0) {
    (*glad_glDeleteQueries)(2,g_gl.clocks[0]->queries);
    free(__ptr_00[0]);
  }
  lVar4 = 0;
  do {
    __ptr = g_gl.streams[lVar4];
    if (__ptr != (djg_buffer *)0x0) {
      (*glad_glDeleteBuffers)(1,&__ptr->gl);
      free(__ptr);
    }
    lVar4 = lVar4 + 1;
  } while (lVar4 != 3);
  lVar4 = 0;
  do {
    GVar2 = (*glad_glIsProgram)(*(GLuint *)((long)g_gl.programs + lVar4));
    if (GVar2 != '\0') {
      (*glad_glDeleteProgram)(*(GLuint *)((long)g_gl.programs + lVar4));
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  lVar4 = 0;
  do {
    GVar2 = (*glad_glIsTexture)(*(GLuint *)((long)g_gl.textures + lVar4));
    if (GVar2 != '\0') {
      (*glad_glDeleteTextures)(1,(GLuint *)(lVar4 + 0x2098c4));
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0x18);
  lVar4 = 0;
  do {
    GVar2 = (*glad_glIsBuffer)(*(GLuint *)((long)g_gl.buffers + lVar4));
    if (GVar2 != '\0') {
      (*glad_glDeleteBuffers)(1,(GLuint *)(lVar4 + 0x2098e4));
    }
    lVar4 = lVar4 + 4;
  } while (lVar4 != 0xc);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    GVar2 = (*glad_glIsFramebuffer)(g_gl.framebuffers[lVar4]);
    if (GVar2 != '\0') {
      (*glad_glDeleteFramebuffers)(1,(GLuint *)(lVar4 * 4 + 0x2098bc));
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  lVar4 = 0;
  bVar1 = true;
  do {
    bVar3 = bVar1;
    GVar2 = (*glad_glIsVertexArray)(g_gl.vertexArrays[lVar4]);
    if (GVar2 != '\0') {
      (*glad_glDeleteVertexArrays)(1,(GLuint *)(lVar4 * 4 + 0x2098dc));
    }
    lVar4 = 1;
    bVar1 = false;
  } while (bVar3);
  return;
}

Assistant:

void release()
{
    int i;

    for (i = 0; i < CLOCK_COUNT; ++i)
        if (g_gl.clocks[i])
            djgc_release(g_gl.clocks[i]);
    for (i = 0; i < STREAM_COUNT; ++i)
        if (g_gl.streams[i])
            djgb_release(g_gl.streams[i]);
    for (i = 0; i < PROGRAM_COUNT; ++i)
        if (glIsProgram(g_gl.programs[i]))
            glDeleteProgram(g_gl.programs[i]);
    for (i = 0; i < TEXTURE_COUNT; ++i)
        if (glIsTexture(g_gl.textures[i]))
            glDeleteTextures(1, &g_gl.textures[i]);
    for (i = 0; i < BUFFER_COUNT; ++i)
        if (glIsBuffer(g_gl.buffers[i]))
            glDeleteBuffers(1, &g_gl.buffers[i]);
    for (i = 0; i < FRAMEBUFFER_COUNT; ++i)
        if (glIsFramebuffer(g_gl.framebuffers[i]))
            glDeleteFramebuffers(1, &g_gl.framebuffers[i]);
    for (i = 0; i < VERTEXARRAY_COUNT; ++i)
        if (glIsVertexArray(g_gl.vertexArrays[i]))
            glDeleteVertexArrays(1, &g_gl.vertexArrays[i]);
}